

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_priority_queue.c
# Opt level: O1

roaring_bitmap_t * roaring_bitmap_or_many_heap(uint32_t number,roaring_bitmap_t **x)

{
  uint8_t type1;
  uint8_t type2;
  uint end_index;
  container_t *c2;
  bool bVar1;
  roaring_bitmap_t *sa;
  uint start_index;
  roaring_bitmap_t *prVar2;
  roaring_pq_t *pq;
  size_t sVar3;
  roaring_array_t *prVar4;
  shared_container_t *psVar5;
  ulong uVar6;
  uint32_t i;
  ulong uVar7;
  roaring_pq_element_t *prVar8;
  uint uVar9;
  container_t *c1;
  ushort key;
  long lVar10;
  uint uVar11;
  ushort key_00;
  roaring_pq_element_t newelement;
  roaring_pq_element_t x2;
  roaring_pq_element_t X;
  uint local_bc;
  container_t *local_b8;
  roaring_pq_element_t local_78;
  roaring_pq_element_t local_60;
  roaring_pq_element_t local_48;
  
  if (number == 1) {
    prVar2 = roaring_bitmap_copy(*x);
    return prVar2;
  }
  if (number == 0) {
    prVar2 = roaring_bitmap_create_with_capacity(0);
    return prVar2;
  }
  uVar6 = (ulong)number;
  pq = (roaring_pq_t *)roaring_malloc(uVar6 * 0x18 + 0x10);
  pq->elements = (roaring_pq_element_t *)(pq + 1);
  pq->size = uVar6;
  lVar10 = 0;
  uVar7 = 0;
  do {
    prVar8 = pq->elements;
    *(roaring_bitmap_t **)((long)&prVar8->bitmap + lVar10) = x[uVar7];
    (&prVar8->is_temporary)[lVar10] = false;
    sVar3 = roaring_bitmap_portable_size_in_bytes(x[uVar7]);
    *(size_t *)((long)&pq->elements->size + lVar10) = sVar3;
    uVar7 = uVar7 + 1;
    lVar10 = lVar10 + 0x18;
  } while (uVar6 != uVar7);
  uVar11 = number >> 1;
  do {
    percolate_down(pq,uVar11);
    bVar1 = 0 < (int)uVar11;
    uVar11 = uVar11 - 1;
  } while (bVar1);
  uVar7 = pq->size;
  do {
    if (uVar7 < 2) {
      pq_poll(&local_48,pq);
      roaring_bitmap_repair_after_lazy(local_48.bitmap);
      roaring_free(pq);
      return (roaring_bitmap_t *)&(local_48.bitmap)->high_low_container;
    }
    prVar8 = &local_48;
    pq_poll(prVar8,pq);
    pq_poll(&local_60,pq);
    sa = local_48.bitmap;
    prVar2 = local_60.bitmap;
    if ((local_48.is_temporary == true) && (local_60.is_temporary == true)) {
      local_78.size = local_78.size & 0xffffffffffffff00;
      uVar11 = *(uint *)&(local_48.bitmap)->high_low_container;
      if (uVar11 == 0) {
        roaring_bitmap_free(local_48.bitmap);
        prVar4 = &prVar2->high_low_container;
      }
      else {
        end_index = *(uint *)&(local_60.bitmap)->high_low_container;
        if (end_index == 0) {
          roaring_bitmap_free(local_60.bitmap);
          prVar4 = &sa->high_low_container;
        }
        else {
          uVar9 = end_index;
          if ((int)uVar11 < (int)end_index) {
            uVar9 = uVar11;
          }
          prVar4 = &roaring_bitmap_create_with_capacity(uVar9)->high_low_container;
          key = **(uint16_t **)((long)sa + 0x10);
          key_00 = **(uint16_t **)((long)prVar2 + 0x10);
          local_bc = 0;
          uVar9 = 0;
          do {
            while( true ) {
              while( true ) {
                if (key != key_00) break;
                uVar7 = (ulong)(ushort)local_bc;
                psVar5 = (shared_container_t *)(*(void ***)((long)sa + 8))[uVar7];
                if ((*(uint8_t **)((long)sa + 0x18))[uVar7] == '\x04') {
                  psVar5 = (shared_container_t *)
                           shared_container_extract_copy
                                     (psVar5,*(uint8_t **)((long)sa + 0x18) + uVar7);
                }
                uVar6 = (ulong)((local_bc & 0xffff) * 8);
                *(shared_container_t **)((long)*(void ***)((long)sa + 8) + uVar6) = psVar5;
                type1 = (*(uint8_t **)((long)sa + 0x18))[uVar7];
                c1 = *(container_t **)((long)*(void ***)((long)sa + 8) + uVar6);
                uVar7 = (ulong)uVar9 & 0xffff;
                psVar5 = (shared_container_t *)(*(void ***)((long)prVar2 + 8))[uVar7];
                if ((*(uint8_t **)((long)prVar2 + 0x18))[uVar7] == '\x04') {
                  psVar5 = (shared_container_t *)
                           shared_container_extract_copy
                                     (psVar5,*(uint8_t **)((long)prVar2 + 0x18) + uVar7);
                }
                uVar6 = (ulong)(uint)((int)uVar7 * 8);
                *(shared_container_t **)((long)*(void ***)((long)prVar2 + 8) + uVar6) = psVar5;
                type2 = (*(uint8_t **)((long)prVar2 + 0x18))[uVar7];
                c2 = *(container_t **)((long)*(void ***)((long)prVar2 + 8) + uVar6);
                if ((type2 == '\x01') && (type1 != '\x01')) {
                  local_b8 = container_lazy_ior(c2,'\x01',c1,type1,(uint8_t *)&local_78);
                  container_free(c1,type1);
                  c1 = c2;
                  type1 = '\x01';
                }
                else {
                  local_b8 = container_lazy_ior(c1,type1,c2,type2,(uint8_t *)&local_78);
                  container_free(c2,type2);
                }
                if (local_b8 != c1) {
                  container_free(c1,type1);
                }
                ra_append(prVar4,key,local_b8,(uint8_t)local_78.size);
                local_bc = local_bc + 1;
                if (end_index - 1 == uVar9 || local_bc == uVar11) {
                  start_index = uVar9 + 1;
                  goto LAB_0010bad7;
                }
                key = (*(uint16_t **)((long)sa + 0x10))[local_bc & 0xffff];
                key_00 = (*(uint16_t **)((long)prVar2 + 0x10))[uVar9 + 1 & 0xffff];
                uVar9 = uVar9 + 1;
              }
              if (key_00 <= key) break;
              ra_append(prVar4,key,(*(void ***)((long)sa + 8))[local_bc & 0xffff],
                        (*(uint8_t **)((long)sa + 0x18))[local_bc & 0xffff]);
              local_bc = local_bc + 1;
              start_index = uVar9;
              if (local_bc == uVar11) goto LAB_0010bad7;
              key = (*(uint16_t **)((long)sa + 0x10))[local_bc & 0xffff];
            }
            uVar7 = (ulong)uVar9 & 0xffff;
            ra_append(prVar4,key_00,(*(void ***)((long)prVar2 + 8))[uVar7],
                      (*(uint8_t **)((long)prVar2 + 0x18))[uVar7]);
            start_index = uVar9 + 1;
            if (end_index - 1 != uVar9) {
              key_00 = (*(uint16_t **)((long)prVar2 + 0x10))[start_index & 0xffff];
            }
            uVar9 = start_index;
          } while (end_index != start_index);
LAB_0010bad7:
          if (local_bc == uVar11) {
            ra_append_move_range(prVar4,&prVar2->high_low_container,start_index,end_index);
          }
          else if (start_index == end_index) {
            ra_append_move_range(prVar4,&sa->high_low_container,local_bc,uVar11);
          }
          ra_clear_without_containers(&sa->high_low_container);
          ra_clear_without_containers(&prVar2->high_low_container);
          roaring_free(sa);
          roaring_free(prVar2);
        }
      }
      local_78.size = roaring_bitmap_portable_size_in_bytes((roaring_bitmap_t *)prVar4);
      local_78.is_temporary =
           &prVar2->high_low_container != prVar4 || &sa->high_low_container != prVar4;
      local_78.bitmap = (roaring_bitmap_t *)prVar4;
LAB_0010bb7d:
      prVar8 = &local_78;
    }
    else if (local_60.is_temporary == true) {
      roaring_bitmap_lazy_or_inplace(local_60.bitmap,local_48.bitmap,false);
      local_60.size = roaring_bitmap_portable_size_in_bytes(prVar2);
      prVar8 = &local_60;
    }
    else {
      if (local_48.is_temporary == false) {
        prVar4 = &roaring_bitmap_lazy_or(local_48.bitmap,local_60.bitmap,false)->high_low_container;
        local_78.size = roaring_bitmap_portable_size_in_bytes((roaring_bitmap_t *)prVar4);
        local_78.is_temporary = true;
        local_78.bitmap = (roaring_bitmap_t *)prVar4;
        goto LAB_0010bb7d;
      }
      roaring_bitmap_lazy_or_inplace(local_48.bitmap,local_60.bitmap,false);
      local_48.size = roaring_bitmap_portable_size_in_bytes(sa);
    }
    pq_add(pq,prVar8);
    uVar7 = pq->size;
  } while( true );
}

Assistant:

roaring_bitmap_t *roaring_bitmap_or_many_heap(uint32_t number,
                                              const roaring_bitmap_t **x) {
    if (number == 0) {
        return roaring_bitmap_create();
    }
    if (number == 1) {
        return roaring_bitmap_copy(x[0]);
    }
    roaring_pq_t *pq = create_pq(x, number);
    while (pq->size > 1) {
        roaring_pq_element_t x1 = pq_poll(pq);
        roaring_pq_element_t x2 = pq_poll(pq);

        if (x1.is_temporary && x2.is_temporary) {
            roaring_bitmap_t *newb =
                lazy_or_from_lazy_inputs(x1.bitmap, x2.bitmap);
            // should normally return a fresh new bitmap *except* that
            // it can return x1.bitmap or x2.bitmap in degenerate cases
            bool temporary = !((newb == x1.bitmap) && (newb == x2.bitmap));
            uint64_t bsize = roaring_bitmap_portable_size_in_bytes(newb);
            roaring_pq_element_t newelement = {
                .size = bsize, .is_temporary = temporary, .bitmap = newb};
            pq_add(pq, &newelement);
        } else if (x2.is_temporary) {
            roaring_bitmap_lazy_or_inplace(x2.bitmap, x1.bitmap, false);
            x2.size = roaring_bitmap_portable_size_in_bytes(x2.bitmap);
            pq_add(pq, &x2);
        } else if (x1.is_temporary) {
            roaring_bitmap_lazy_or_inplace(x1.bitmap, x2.bitmap, false);
            x1.size = roaring_bitmap_portable_size_in_bytes(x1.bitmap);

            pq_add(pq, &x1);
        } else {
            roaring_bitmap_t *newb =
                roaring_bitmap_lazy_or(x1.bitmap, x2.bitmap, false);
            uint64_t bsize = roaring_bitmap_portable_size_in_bytes(newb);
            roaring_pq_element_t newelement = {
                .size = bsize, .is_temporary = true, .bitmap = newb};

            pq_add(pq, &newelement);
        }
    }
    roaring_pq_element_t X = pq_poll(pq);
    roaring_bitmap_t *answer = X.bitmap;
    roaring_bitmap_repair_after_lazy(answer);
    pq_free(pq);
    return answer;
}